

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::boxed_cast<chaiscript::Boxed_Value>
          (chaiscript *this,Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  bool bVar1;
  Type_Info *pTVar2;
  Type_Conversions *pTVar3;
  Conversion_Saves *from;
  bad_boxed_cast *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Boxed_Value BVar5;
  byte local_d1;
  byte local_b1;
  bad_any_cast *anon_var_0_1;
  undefined1 local_60 [24];
  bad_any_cast *anon_var_0;
  Type_Info local_38;
  Type_Conversions_State *local_20;
  Type_Conversions_State *t_conversions_local;
  Boxed_Value *bv_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  local_b1 = 1;
  local_20 = t_conversions;
  t_conversions_local = (Type_Conversions_State *)bv;
  bv_local = (Boxed_Value *)this;
  if (t_conversions != (Type_Conversions_State *)0x0) {
    pTVar2 = Boxed_Value::get_type_info(bv);
    user_type<chaiscript::Boxed_Value>();
    bVar1 = Type_Info::bare_equal(pTVar2,&local_38);
    local_b1 = 1;
    if (!bVar1) {
      local_d1 = 0;
      if (local_20 != (Type_Conversions_State *)0x0) {
        pTVar3 = Type_Conversions_State::operator->(local_20);
        bVar1 = Type_Conversions::convertable_type<chaiscript::Boxed_Value>(pTVar3);
        local_d1 = bVar1 ^ 0xff;
      }
      local_b1 = local_d1;
    }
  }
  if ((local_b1 & 1) != 0) {
    BVar5 = detail::Cast_Helper<chaiscript::Boxed_Value>::cast
                      ((Boxed_Value *)this,t_conversions_local);
    _Var4._M_pi = BVar5.m_data.
                  super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
LAB_005eac15:
    BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var4._M_pi;
    BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (Boxed_Value)
           BVar5.m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
  }
  if (local_20 != (Type_Conversions_State *)0x0) {
    pTVar3 = Type_Conversions_State::operator->(local_20);
    bVar1 = Type_Conversions::convertable_type<chaiscript::Boxed_Value>(pTVar3);
    if (bVar1) {
      pTVar3 = Type_Conversions_State::operator->(local_20);
      from = Type_Conversions_State::saves(local_20);
      Type_Conversions::boxed_type_conversion<chaiscript::Boxed_Value>
                ((Type_Conversions *)local_60,(Conversion_Saves *)pTVar3,(Boxed_Value *)from);
      detail::Cast_Helper<chaiscript::Boxed_Value>::cast
                ((Boxed_Value *)this,(Type_Conversions_State *)local_60);
      Boxed_Value::~Boxed_Value((Boxed_Value *)local_60);
      _Var4._M_pi = extraout_RDX;
      goto LAB_005eac15;
    }
  }
  this_00 = (bad_boxed_cast *)__cxa_allocate_exception(0x38);
  pTVar2 = Boxed_Value::get_type_info((Boxed_Value *)t_conversions_local);
  exception::bad_boxed_cast::bad_boxed_cast(this_00,*pTVar2,(type_info *)&Boxed_Value::typeinfo);
  __cxa_throw(this_00,&exception::bad_boxed_cast::typeinfo,
              exception::bad_boxed_cast::~bad_boxed_cast);
}

Assistant:

decltype(auto) boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr) {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }

    if (t_conversions && (*t_conversions)->convertable_type<Type>()) {
      try {
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions));
      } catch (...) {
        try {
          // try going the other way
          return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv),
                                                  t_conversions));
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not convertable, just throw the error, don't waste the time on the
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }
  }